

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseTypeModuleField(WastParser *this,Module *module)

{
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var1;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  Result RVar5;
  Result RVar6;
  TypeModuleField *pTVar7;
  long lVar8;
  string name;
  Location loc;
  BindingHash bindings;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> local_140;
  Enum local_134;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_130;
  undefined1 local_128 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_118;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  string local_c8;
  __node_base_ptr *local_a8;
  size_type sStack_a0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_98;
  undefined8 uStack_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_128,this);
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)local_118.field_1.offset;
  local_88._M_element_count = local_118._8_8_;
  local_88._M_buckets = (__buckets_ptr)local_128._0_8_;
  local_88._M_bucket_count = local_128._8_8_;
  pTVar7 = (TypeModuleField *)operator_new(0x48);
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.filename.data_ =
       (char *)local_88._M_buckets;
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.filename.size_ =
       local_88._M_bucket_count;
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.field_1.field_1.
  offset = (size_t)local_88._M_before_begin._M_nxt;
  *(size_type *)
   ((long)&(pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.loc.field_1
   + 8) = local_88._M_element_count;
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.type_ = Type;
  (pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__TypeModuleField_00207b10;
  (pTVar7->type)._M_t.super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)0x0;
  RVar5 = Expect(this,Type);
  RVar6.enum_ = Error;
  if (RVar5.enum_ == Error) goto LAB_00185c88;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_c8);
  RVar5 = Expect(this,Lpar);
  RVar6.enum_ = Error;
  if (RVar5.enum_ != Error) {
    GetToken((Token *)local_128,this);
    local_98.offset = (size_t)local_118.field_1.offset;
    uStack_90 = local_118._8_8_;
    local_a8 = (__node_base_ptr *)local_128._0_8_;
    sStack_a0 = local_128._8_8_;
    bVar4 = Match(this,First_RefKind);
    if (bVar4) {
      MakeUnique<wabt::FuncType,std::__cxx11::string&>((wabt *)&local_140,&local_c8);
      local_88._M_buckets = &local_88._M_single_bucket;
      local_88._M_bucket_count = 1;
      local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_88._M_element_count = 0;
      local_88._M_rehash_policy._M_max_load_factor = 1.0;
      local_88._M_rehash_policy._M_next_resize = 0;
      local_88._M_single_bucket = (__node_base_ptr)0x0;
      RVar5 = ParseFuncSignature(this,(FuncSignature *)(local_140._M_head_impl + 1),
                                 (BindingHash *)&local_88);
      if (RVar5.enum_ != Error) {
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"param","");
        local_108[0] = local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"result","");
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   (string *)local_128,local_e8);
        lVar8 = 0;
        local_134 = (Enum)ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&local_48,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        do {
          if (local_f8 + lVar8 != *(undefined1 **)((long)local_108 + lVar8)) {
            operator_delete(*(undefined1 **)((long)local_108 + lVar8));
          }
          _Var1._M_head_impl = local_140._M_head_impl;
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != -0x40);
        if (local_134 != Error) {
          local_140._M_head_impl = (TypeEntry *)0x0;
          _Var2._M_head_impl =
               (pTVar7->type)._M_t.
               super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
               super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
               super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
          (pTVar7->type)._M_t.
          super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
          super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = _Var1._M_head_impl;
          if (_Var2._M_head_impl != (TypeEntry *)0x0) {
            (**(code **)((long)(_Var2._M_head_impl)->_vptr_TypeEntry + 8))();
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::~_Hashtable(&local_88);
          if (local_140._M_head_impl != (TypeEntry *)0x0) {
            (*(local_140._M_head_impl)->_vptr_TypeEntry[1])();
          }
LAB_00185be9:
          RVar5 = Expect(this,Rpar);
          RVar6.enum_ = Error;
          if ((RVar5.enum_ != Error) && (RVar5 = Expect(this,Rpar), RVar5.enum_ != Error)) {
            local_130._M_head_impl = pTVar7;
            Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                        *)&local_130);
            if (local_130._M_head_impl != (TypeModuleField *)0x0) {
              (*((local_130._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_130._M_head_impl = (TypeModuleField *)0x0;
            pTVar7 = (TypeModuleField *)0x0;
            RVar6.enum_ = Ok;
          }
          goto LAB_00185c71;
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::~_Hashtable(&local_88);
      if (local_140._M_head_impl != (TypeEntry *)0x0) {
        (*(local_140._M_head_impl)->_vptr_TypeEntry[1])();
      }
    }
    else {
      bVar4 = Match(this,Struct);
      if (!bVar4) {
        bVar4 = Match(this,Array);
        if (!bVar4) {
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"func","");
          local_108[0] = local_f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"struct","");
          local_e8[0] = local_d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"array","");
          local_88._M_buckets = (__node_base_ptr *)0x0;
          local_88._M_bucket_count = 0;
          local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                     (string *)local_128,&local_c8);
          lVar8 = 0;
          RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_88,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88);
          do {
            if (local_d8 + lVar8 != *(undefined1 **)((long)local_e8 + lVar8)) {
              operator_delete(*(undefined1 **)((long)local_e8 + lVar8));
            }
            lVar8 = lVar8 + -0x20;
          } while (lVar8 != -0x60);
          goto LAB_00185c71;
        }
        if ((this->options_->features).gc_enabled_ == false) {
          Error(this,0x1d57fc);
        }
        MakeUnique<wabt::ArrayType,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
        RVar5 = ParseField(this,(Field *)(local_128._0_8_ + 0x50));
LAB_00185b62:
        uVar3 = local_128._0_8_;
        if (RVar5.enum_ != Error) {
          local_128._0_8_ = (__node_base_ptr *)0x0;
          _Var1._M_head_impl =
               (pTVar7->type)._M_t.
               super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
               super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
               super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
          (pTVar7->type)._M_t.
          super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
          super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)uVar3;
          if (_Var1._M_head_impl == (TypeEntry *)0x0) goto LAB_00185be9;
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_TypeEntry + 8))();
        }
        if ((__node_base_ptr *)local_128._0_8_ != (__node_base_ptr *)0x0) {
          (*(code *)(*(__node_base_ptr *)local_128._0_8_)[1]._M_nxt)();
        }
        RVar6.enum_ = Error;
        if (RVar5.enum_ != Error) goto LAB_00185be9;
        goto LAB_00185c71;
      }
      if ((this->options_->features).gc_enabled_ != false) {
        MakeUnique<wabt::StructType,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
        RVar5 = ParseFieldList(this,(vector<wabt::Field,_std::allocator<wabt::Field>_> *)
                                    (local_128._0_8_ + 0x50));
        goto LAB_00185b62;
      }
      Error(this,0x1dc0fe);
    }
    RVar6.enum_ = Error;
  }
LAB_00185c71:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (pTVar7 == (TypeModuleField *)0x0) {
    return (Result)RVar6.enum_;
  }
LAB_00185c88:
  (*(pTVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField._vptr_ModuleField
    [1])(pTVar7);
  return (Result)RVar6.enum_;
}

Assistant:

Result WastParser::ParseTypeModuleField(Module* module) {
  WABT_TRACE(ParseTypeModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  EXPECT(Type);

  std::string name;
  ParseBindVarOpt(&name);
  EXPECT(Lpar);
  Location loc = GetLocation();

  if (Match(TokenType::Func)) {
    auto func_type = MakeUnique<FuncType>(name);
    BindingHash bindings;
    CHECK_RESULT(ParseFuncSignature(&func_type->sig, &bindings));
    CHECK_RESULT(ErrorIfLpar({"param", "result"}));
    field->type = std::move(func_type);
  } else if (Match(TokenType::Struct)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "struct not allowed");
      return Result::Error;
    }
    auto struct_type = MakeUnique<StructType>(name);
    CHECK_RESULT(ParseFieldList(&struct_type->fields));
    field->type = std::move(struct_type);
  } else if (Match(TokenType::Array)) {
    if (!options_->features.gc_enabled()) {
      Error(loc, "array type not allowed");
    }
    auto array_type = MakeUnique<ArrayType>(name);
    CHECK_RESULT(ParseField(&array_type->field));
    field->type = std::move(array_type);
  } else {
    return ErrorExpected({"func", "struct", "array"});
  }

  EXPECT(Rpar);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}